

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool __thiscall ADehackedPickup::TryPickup(ADehackedPickup *this,AActor **toucher)

{
  bool bVar1;
  uint uVar2;
  PClassActor *type_00;
  AInventory *pAVar3;
  Self local_48;
  TFlags<ActorFlag,_unsigned_int> local_44;
  DVector3 local_40;
  PClassActor *local_28;
  PClassActor *type;
  AActor **toucher_local;
  ADehackedPickup *this_local;
  
  type = (PClassActor *)toucher;
  toucher_local = (AActor **)this;
  type_00 = DetermineType(this);
  if (type_00 == (PClassActor *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = type_00;
    AActor::Pos(&local_40,(AActor *)this);
    pAVar3 = (AInventory *)Spawn(type_00,&local_40,NO_REPLACE);
    this->RealPickup = pAVar3;
    if (this->RealPickup == (AInventory *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      AActor::ClearCounters(&this->RealPickup->super_AActor);
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_44,
                 (int)this +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      if (uVar2 == 0) {
        operator~((EnumType)&local_48);
        TFlags<ActorFlag,_unsigned_int>::operator&=
                  (&(this->RealPickup->super_AActor).flags,&local_48);
      }
      if ((this->droppedbymonster & 1U) != 0) {
        ModifyDropAmount(this->RealPickup,0);
      }
      bVar1 = AInventory::CallTryPickup
                        (this->RealPickup,
                         *(AActor **)
                          &(type->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase,(AActor **)0x0);
      if (bVar1) {
        AInventory::GoAwayAndDie(&this->super_AInventory);
        this_local._7_1_ = true;
      }
      else {
        (*(this->RealPickup->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        this->RealPickup = (AInventory *)0x0;
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ADehackedPickup::TryPickup (AActor *&toucher)
{
	PClassActor *type = DetermineType ();
	if (type == NULL)
	{
		return false;
	}
	RealPickup = static_cast<AInventory *>(Spawn (type, Pos(), NO_REPLACE));
	if (RealPickup != NULL)
	{
		// The internally spawned item should never count towards statistics.
		RealPickup->ClearCounters();
		if (!(flags & MF_DROPPED))
		{
			RealPickup->flags &= ~MF_DROPPED;
		}
		// If this item has been dropped by a monster the
		// amount of ammo this gives must be adjusted.
		if (droppedbymonster)
		{
			ModifyDropAmount(RealPickup, 0);
		}
		if (!RealPickup->CallTryPickup (toucher))
		{
			RealPickup->Destroy ();
			RealPickup = NULL;
			return false;
		}
		GoAwayAndDie ();
		return true;
	}
	return false;
}